

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_color_hsva_bv(nk_byte *out,nk_color in)

{
  byte bVar1;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  int tmp [4];
  ushort local_28 [2];
  ushort auStack_24 [2];
  ushort auStack_20 [2];
  ushort auStack_1c [6];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  nk_color_hsva_i((int *)local_28,(int *)auStack_24,(int *)auStack_20,(int *)auStack_1c,in);
  uVar5 = local_28[0] & 0xff;
  uVar6 = auStack_24[0] & 0xff;
  uVar7 = auStack_20[0] & 0xff;
  uVar8 = auStack_1c[0] & 0xff;
  bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * (char)local_28[0] - (0xff < uVar5);
  bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * (char)auStack_24[0] - (0xff < uVar6);
  bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * (char)auStack_20[0] - (0xff < uVar7);
  bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)auStack_1c[0] - (0xff < uVar8);
  *(uint *)out = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                          CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                   CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                            (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))
                                  ));
  return;
}

Assistant:

NK_API void
nk_color_hsva_bv(nk_byte *out, struct nk_color in)
{
    int tmp[4];
    nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
    out[0] = (nk_byte)tmp[0];
    out[1] = (nk_byte)tmp[1];
    out[2] = (nk_byte)tmp[2];
    out[3] = (nk_byte)tmp[3];
}